

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

void __thiscall
llvm::detail::DoubleAPFloat::toString
          (DoubleAPFloat *this,SmallVectorImpl<char> *Str,uint FormatPrecision,uint FormatMaxPadding
          ,bool TruncateZero)

{
  DoubleAPFloat local_60;
  APFloat local_50;
  
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    bitcastToAPInt(&local_60);
    IEEEFloat::IEEEFloat
              (&local_50.U.IEEE,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)&local_60);
    APFloat::toString(&local_50,Str,FormatPrecision,FormatMaxPadding,TruncateZero);
    APFloat::Storage::~Storage((Storage *)&local_50.U.IEEE);
    if ((0x40 < (uint)local_60.Floats._M_t.
                      super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                      .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl) &&
       (local_60.Semantics != (fltSemantics *)0x0)) {
      operator_delete__(local_60.Semantics);
    }
    return;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x111d,
                "void llvm::detail::DoubleAPFloat::toString(SmallVectorImpl<char> &, unsigned int, unsigned int, bool) const"
               );
}

Assistant:

void DoubleAPFloat::toString(SmallVectorImpl<char> &Str,
                             unsigned FormatPrecision,
                             unsigned FormatMaxPadding,
                             bool TruncateZero) const {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat(semPPCDoubleDoubleLegacy, bitcastToAPInt())
      .toString(Str, FormatPrecision, FormatMaxPadding, TruncateZero);
}